

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int refineBySim2_left(saucy *s,coloring *c)

{
  uint uVar1;
  int *__ptr;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *randVec;
  saucy_graph *__ptr_00;
  void **ppvVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t **__ptr_01;
  Vec_Int_t **in_stack_ffffffffffffffc0;
  
  if (0 < NUM_SIM2_ITERATION) {
    iVar4 = 0;
    do {
      randVec = assignRandomBitsToCells(s->pNtk,c);
      __ptr_00 = buildSim2Graph(s->pNtk,c,randVec,s->iDep,(Vec_Int_t **)s->topOrder,
                                (Vec_Ptr_t **)s->obs,s->ctrl,in_stack_ffffffffffffffc0);
      if (__ptr_00 == (saucy_graph *)0x0) {
        __assert_fail("g != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSaucy.c"
                      ,0x58a,"int refineBySim2_left(struct saucy *, struct coloring *)");
      }
      __ptr_01 = (Vec_Int_t **)__ptr_00->adj;
      s->adj = (int *)__ptr_01;
      __ptr = __ptr_00->edg;
      s->edg = __ptr;
      iVar8 = s->nsplits;
      if (0 < s->n) {
        iVar3 = 0;
        do {
          if (c->clen[iVar3] == 0) {
            piVar6 = s->sinduce;
            iVar7 = s->nsinduce;
            s->nsinduce = iVar7 + 1;
          }
          else {
            piVar6 = s->ninduce;
            iVar7 = s->nninduce;
            s->nninduce = iVar7 + 1;
          }
          piVar6[iVar7] = iVar3;
          s->indmark[iVar3] = '\x01';
          iVar3 = iVar3 + c->clen[iVar3] + 1;
        } while (iVar3 < s->n);
      }
      refine(s,c);
      if (iVar8 < s->nsplits) {
        pVVar2 = s->randomVectorArray_sim2;
        uVar1 = pVVar2->nCap;
        if (pVVar2->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar5;
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar1 * 2;
            if (iVar4 <= (int)uVar1) goto LAB_002a3476;
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
            }
            pVVar2->pArray = ppvVar5;
          }
          pVVar2->nCap = iVar4;
        }
LAB_002a3476:
        iVar4 = pVVar2->nSize;
        pVVar2->nSize = iVar4 + 1;
        pVVar2->pArray[iVar4] = randVec;
        if (0 < s->n) {
          iVar4 = 0;
          do {
            if (c->clen[iVar4] == 0) {
              piVar6 = s->sinduce;
              iVar8 = s->nsinduce;
              s->nsinduce = iVar8 + 1;
            }
            else {
              piVar6 = s->ninduce;
              iVar8 = s->nninduce;
              s->nninduce = iVar8 + 1;
            }
            piVar6[iVar8] = iVar4;
            s->indmark[iVar4] = '\x01';
            iVar4 = iVar4 + c->clen[iVar4] + 1;
          } while (iVar4 < s->n);
        }
        s->adj = s->depAdj;
        s->edg = s->depEdg;
        in_stack_ffffffffffffffc0 = __ptr_01;
        refine(s,c);
        iVar4 = 1;
      }
      else {
        if (randVec->pArray != (int *)0x0) {
          free(randVec->pArray);
          randVec->pArray = (int *)0x0;
        }
        if (randVec != (Vec_Int_t *)0x0) {
          free(randVec);
        }
        iVar4 = iVar4 + 1;
        in_stack_ffffffffffffffc0 = __ptr_01;
      }
      if (__ptr_01 != (Vec_Int_t **)0x0) {
        free(__ptr_01);
        __ptr_00->adj = (int *)0x0;
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
        __ptr_00->edg = (int *)0x0;
      }
      free(__ptr_00);
    } while (iVar4 < NUM_SIM2_ITERATION);
  }
  s->randomVectorSplit_sim2[s->lev] = s->randomVectorArray_sim2->nSize;
  return 1;
}

Assistant:

static int
refineBySim2_left(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;    
    int i, j;
    int nsplits;    
    
    for (i = 0; i < NUM_SIM2_ITERATION; i++) {
        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim2Graph(s->pNtk, c, randVec, s->iDep, s->oDep, s->topOrder, s->obs,  s->ctrl);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;
        
        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {
            /* save the random vector */
            Vec_PtrPush(s->randomVectorArray_sim2, randVec);            
            i = 0; /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        else
            Vec_IntFree(randVec);
        
        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    s->randomVectorSplit_sim2[s->lev] = Vec_PtrSize(s->randomVectorArray_sim2); 

    return 1;
}